

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::invadmin_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  int iVar2;
  clientinfo *ci_00;
  char *pcVar3;
  clientinfo *ci;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    iVar2 = QServ::getSender(&qs);
    ci_00 = QServ::getClient(&qs,iVar2);
    iVar2 = strcmp(invadminpass,args[1]);
    if ((iVar2 == 0) || (invadminpass == args[1])) {
      ci_00->privilege = 3;
      ci_00->isInvAdmin = true;
      sendf(ci_00->clientnum,1,"ris",0x23,"Invisible \f6admin \f7activated");
      pcVar3 = colorname(ci_00);
      out(1,"%s became an invisible admin",pcVar3);
      pcVar3 = colorname(ci_00);
      out(2,"%s became an invisible admin",pcVar3);
    }
    else {
      sendf(ci_00->clientnum,1,"ris",0x23,"\f3Error: Incorrect admin password");
    }
  }
  return;
}

Assistant:

QSERV_CALLBACK invadmin_cmd(p) {
        if(CMD_SA) {
            clientinfo *ci = qs.getClient(CMD_SENDER);
            if(!strcmp(invadminpass, args[1]) || invadminpass == args[1]) {
                ci->privilege = PRIV_ADMIN;
                ci->isInvAdmin = true;
                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "Invisible \f6admin \f7activated");
                out(ECHO_IRC, "%s became an invisible admin", colorname(ci));
                out(ECHO_CONSOLE, "%s became an invisible admin", colorname(ci));
            }
            else sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Incorrect admin password");
        }
    }